

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

JBLOCKARRAY alloc_barray(j_common_ptr cinfo,int pool_id,JDIMENSION blocksperrow,JDIMENSION numrows)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  JBLOCKARRAY ppaJVar5;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  long ltemp;
  JDIMENSION i;
  JDIMENSION currow;
  JDIMENSION rowsperchunk;
  JBLOCKROW workspace;
  JBLOCKARRAY result;
  my_mem_ptr mem;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  j_common_ptr in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int pool_id_00;
  j_common_ptr cinfo_00;
  
  pool_id_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  cinfo_00 = (j_common_ptr)in_RDI[1];
  auVar1 = ZEXT416(0) << 0x40 | ZEXT816(0x3b9ac9e8);
  auVar2 = auVar1 / (ZEXT416(in_EDX) << 7);
  uVar4 = auVar2._0_8_;
  if (uVar4 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x46;
    (**(code **)*in_RDI)(in_RDI,in_RSI,SUB168(auVar1 % (ZEXT416(in_EDX) << 7),0));
  }
  local_4c = in_ECX;
  if (uVar4 < in_ECX) {
    local_4c = auVar2._0_4_;
  }
  *(uint *)&cinfo_00[4].err = local_4c;
  ppaJVar5 = (JBLOCKARRAY)alloc_small(cinfo_00,pool_id_00,(size_t)in_stack_ffffffffffffffd0);
  local_38 = 0;
  while (local_38 < in_ECX) {
    if (in_ECX - local_38 <= local_4c) {
      local_4c = in_ECX - local_38;
    }
    in_stack_ffffffffffffffd0 =
         (j_common_ptr)
         alloc_large(in_stack_ffffffffffffffd0,local_4c,
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    for (uVar3 = local_4c; uVar3 != 0; uVar3 = uVar3 - 1) {
      ppaJVar5[local_38] = (JBLOCKROW)in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd0 =
           (j_common_ptr)((long)in_stack_ffffffffffffffd0 + (ulong)in_EDX * 0x80);
      local_38 = local_38 + 1;
    }
    in_stack_ffffffffffffffc4 = 0;
  }
  return ppaJVar5;
}

Assistant:

METHODDEF(JBLOCKARRAY)
alloc_barray(j_common_ptr cinfo, int pool_id, JDIMENSION blocksperrow,
             JDIMENSION numrows)
/* Allocate a 2-D coefficient-block array */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  JBLOCKARRAY result;
  JBLOCKROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Make sure each row is properly aligned */
  if ((sizeof(JBLOCK) % ALIGN_SIZE) != 0)
    out_of_memory(cinfo, 6);    /* safety check */

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK - sizeof(large_pool_hdr)) /
          ((long)blocksperrow * sizeof(JBLOCK));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long)numrows)
    rowsperchunk = (JDIMENSION)ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JBLOCKARRAY)alloc_small(cinfo, pool_id,
                                    (size_t)(numrows * sizeof(JBLOCKROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JBLOCKROW)alloc_large(cinfo, pool_id,
        (size_t)((size_t)rowsperchunk * (size_t)blocksperrow *
                  sizeof(JBLOCK)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += blocksperrow;
    }
  }

  return result;
}